

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O0

void cf_h2_proxy_close(Curl_cfilter *cf,Curl_easy *data)

{
  cf_h2_proxy_ctx *ctx_00;
  undefined8 uVar1;
  cf_call_data save;
  cf_h2_proxy_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  ctx_00 = (cf_h2_proxy_ctx *)cf->ctx;
  if (ctx_00 != (cf_h2_proxy_ctx *)0x0) {
    uVar1 = *(undefined8 *)((long)cf->ctx + 8);
    *(Curl_easy **)((long)cf->ctx + 8) = data;
    cf_h2_proxy_ctx_clear(ctx_00);
    *(undefined8 *)((long)cf->ctx + 8) = uVar1;
  }
  if (cf->next != (Curl_cfilter *)0x0) {
    (*(code *)cf->next->cft->do_close)(cf->next,data);
  }
  return;
}

Assistant:

static void cf_h2_proxy_close(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct cf_h2_proxy_ctx *ctx = cf->ctx;

  if(ctx) {
    struct cf_call_data save;

    CF_DATA_SAVE(save, cf, data);
    cf_h2_proxy_ctx_clear(ctx);
    CF_DATA_RESTORE(cf, save);
  }
  if(cf->next)
    cf->next->cft->do_close(cf->next, data);
}